

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::operator+[abi_cxx11_(string *__return_storage_ptr__,Catch *this,char *lhs,StringRef *rhs)

{
  string local_78;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  StringRef *local_20;
  StringRef *rhs_local;
  char *lhs_local;
  
  local_20 = (StringRef *)lhs;
  rhs_local = (StringRef *)this;
  lhs_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,(char *)this,&local_41);
  StringRef::operator_cast_to_string(&local_78,local_20);
  std::operator+(__return_storage_ptr__,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

auto operator + ( char const* lhs, StringRef const& rhs ) -> std::string {
        return std::string( lhs ) + std::string( rhs );
    }